

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteColumnNames(sqlite3 *db,Table *pTable)

{
  sqlite3 *in_RSI;
  long in_RDI;
  Column *pCol;
  int i;
  ExprList *in_stack_ffffffffffffffd8;
  sqlite3 *db_00;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  
  db_00 = (sqlite3 *)in_RSI->pVdbe;
  if (db_00 != (sqlite3 *)0x0) {
    for (iVar1 = 0; iVar1 < *(short *)((long)&in_RSI->flags + 6); iVar1 = iVar1 + 1) {
      sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
      db_00 = (sqlite3 *)&db_00->pDfltColl;
    }
    sqlite3DbNNFreeNN(in_RSI,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    if (*(char *)((long)&in_RSI->lastRowid + 7) == '\0') {
      sqlite3ExprListDelete(db_00,in_stack_ffffffffffffffd8);
    }
    if (*(long *)(in_RDI + 0x300) == 0) {
      in_RSI->pVdbe = (Vdbe *)0x0;
      *(undefined2 *)((long)&in_RSI->flags + 6) = 0;
      if (*(char *)((long)&in_RSI->lastRowid + 7) == '\0') {
        in_RSI->errCode = 0;
        in_RSI->errByteOffset = 0;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteColumnNames(sqlite3 *db, Table *pTable){
  int i;
  Column *pCol;
  assert( pTable!=0 );
  assert( db!=0 );
  if( (pCol = pTable->aCol)!=0 ){
    for(i=0; i<pTable->nCol; i++, pCol++){
      assert( pCol->zCnName==0 || pCol->hName==sqlite3StrIHash(pCol->zCnName) );
      sqlite3DbFree(db, pCol->zCnName);
    }
    sqlite3DbNNFreeNN(db, pTable->aCol);
    if( IsOrdinaryTable(pTable) ){
      sqlite3ExprListDelete(db, pTable->u.tab.pDfltList);
    }
    if( db->pnBytesFreed==0 ){
      pTable->aCol = 0;
      pTable->nCol = 0;
      if( IsOrdinaryTable(pTable) ){
        pTable->u.tab.pDfltList = 0;
      }
    }
  }
}